

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  _json_value *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  char *pcVar14;
  uchar uVar15;
  byte bVar16;
  uchar uVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  ushort **ppuVar22;
  char *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  double dVar23;
  json_value *parent;
  json_uchar uchar2;
  char b;
  uint string_length;
  char *string;
  uchar uc_b4;
  uchar uc_b3;
  uchar uc_b2;
  uchar uc_b1;
  json_uchar uchar;
  int64_t num_fraction;
  long num_e;
  long num_digits;
  long flags;
  char *end;
  json_state state;
  json_value *alloc;
  json_value *root;
  json_value *top;
  char error [128];
  char cVar24;
  undefined8 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  json_type in_stack_fffffffffffffe3c;
  json_settings *in_stack_fffffffffffffe40;
  json_value **in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  json_type in_stack_fffffffffffffe58;
  undefined3 uVar25;
  undefined4 in_stack_fffffffffffffe5c;
  char local_165;
  uint local_164;
  _json_value *local_160;
  undefined2 local_156;
  uint local_154;
  long local_150;
  json_settings *local_148;
  long local_140;
  ulong local_138;
  ulong local_120;
  char *local_118;
  json_value *local_108;
  undefined1 local_100 [8];
  uint local_f8 [2];
  long local_f0;
  undefined1 auStack_e8 [8];
  uint local_e0;
  code *local_d8;
  code *local_d0;
  undefined8 local_c8;
  int local_b8;
  char *local_b0;
  uint local_a8;
  uint local_a4;
  json_value *local_a0;
  json_value *local_98;
  _json_value *local_90;
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = (json_value *)0x0;
  memset(local_100,0,0x60);
  local_140 = 0;
  local_148 = (json_settings *)0x0;
  local_150 = 0;
  local_120 = in_RDX;
  local_118 = in_RSI;
  if ((((2 < in_RDX) && (*in_RSI == -0x11)) && (in_RSI[1] == -0x45)) && (in_RSI[2] == -0x41)) {
    local_118 = in_RSI + 3;
    local_120 = in_RDX - 3;
  }
  local_88[0] = '\0';
  pcVar21 = local_118 + local_120;
  memcpy(auStack_e8,in_RDI,0x30);
  if (local_d8 == (code *)0x0) {
    local_d8 = default_alloc;
  }
  if (local_d0 == (code *)0x0) {
    local_d0 = default_free;
  }
  memset(local_f8,0xff,4);
  memset(&local_f0,0xff,8);
  local_f8[0] = local_f8[0] - 8;
  local_f0 = local_f0 + -8;
  local_b8 = 1;
LAB_00218a23:
  if (local_b8 < 0) {
    local_108 = local_98;
LAB_0021a718:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return local_108;
    }
    __stack_chk_fail();
  }
  local_160 = (_json_value *)0x0;
  local_164 = 0;
  local_98 = (json_value *)0x0;
  local_90 = (_json_value *)0x0;
  local_138 = 8;
  bVar12 = false;
  bVar11 = false;
  bVar10 = false;
  bVar9 = false;
  bVar8 = false;
  bVar7 = false;
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  local_a8 = 1;
  local_b0 = local_118;
  do {
    uVar13 = local_138;
    if (local_b0 == pcVar21) {
      local_165 = '\0';
    }
    else {
      local_165 = *local_b0;
    }
    if (bVar3) {
      if (local_165 == '\0') {
        sprintf(local_88,"Unexpected EOF in string (at %d:%d)",(ulong)local_a8,(ulong)local_a4);
        goto LAB_0021a640;
      }
      if (local_164 <= local_f8[0]) {
        if (bVar4) {
          bVar4 = false;
          switch(local_165) {
          case 'b':
            if (local_b8 == 0) {
              *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 8;
            }
            local_164 = local_164 + 1;
            break;
          default:
            if (local_b8 == 0) {
              *(char *)((long)&local_160->parent + (ulong)local_164) = local_165;
            }
            local_164 = local_164 + 1;
            break;
          case 'f':
            if (local_b8 == 0) {
              *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 0xc;
            }
            local_164 = local_164 + 1;
            break;
          case 'n':
            if (local_b8 == 0) {
              *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 10;
            }
            local_164 = local_164 + 1;
            break;
          case 'r':
            if (local_b8 == 0) {
              *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 0xd;
            }
            local_164 = local_164 + 1;
            break;
          case 't':
            if (local_b8 == 0) {
              *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 9;
            }
            local_164 = local_164 + 1;
            break;
          case 'u':
            if (4 < (long)pcVar21 - (long)local_b0) {
              local_b0 = local_b0 + 1;
              cVar24 = (char)((ulong)in_stack_fffffffffffffe30 >> 0x30);
              uVar15 = hex_value(cVar24);
              if (uVar15 != 0xff) {
                local_b0 = local_b0 + 1;
                bVar16 = hex_value(cVar24);
                if (bVar16 != 0xff) {
                  local_b0 = local_b0 + 1;
                  uVar17 = hex_value(cVar24);
                  if (uVar17 != 0xff) {
                    local_b0 = local_b0 + 1;
                    bVar18 = hex_value(cVar24);
                    if (bVar18 != 0xff) {
                      local_156 = CONCAT11(uVar15 << 4 | bVar16,uVar17 << 4 | bVar18);
                      local_154 = (uint)local_156;
                      if ((local_154 & 0xf800) == 0xd800) {
                        pcVar14 = local_b0;
                        if (((6 < (long)pcVar21 - (long)local_b0) &&
                            (pcVar14 = local_b0 + 1, local_b0[1] == '\\')) &&
                           (pcVar14 = local_b0 + 2, local_b0[2] == 'u')) {
                          local_b0 = local_b0 + 3;
                          uVar15 = hex_value(cVar24);
                          pcVar14 = local_b0;
                          if (uVar15 != 0xff) {
                            local_b0 = local_b0 + 1;
                            uVar15 = hex_value(cVar24);
                            pcVar14 = local_b0;
                            if (uVar15 != 0xff) {
                              local_b0 = local_b0 + 1;
                              uVar17 = hex_value(cVar24);
                              pcVar14 = local_b0;
                              if (uVar17 != 0xff) {
                                local_b0 = local_b0 + 1;
                                bVar16 = hex_value(cVar24);
                                pcVar14 = local_b0;
                                if (bVar16 != 0xff) {
                                  local_156 = CONCAT11(uVar15,uVar17 << 4 | bVar16);
                                  local_154 = (local_154 & 0x3ff) << 10 | 0x10000 |
                                              local_156 & 0x3ff;
                                  goto LAB_00218f7e;
                                }
                              }
                            }
                          }
                        }
                        local_b0 = pcVar14;
                        sprintf(local_88,"Invalid character value `%c` (at %d:%d)",
                                (ulong)(uint)(int)local_165,(ulong)local_a8,(ulong)local_a4);
                        goto LAB_0021a640;
                      }
LAB_00218f7e:
                      bVar16 = (byte)local_154;
                      if (local_154 < 0x80) {
                        if (local_b8 == 0) {
                          *(byte *)((long)&local_160->parent + (ulong)local_164) = bVar16;
                        }
                        local_164 = local_164 + 1;
                      }
                      else if (local_154 < 0x800) {
                        if (local_b8 == 0) {
                          *(byte *)((long)&local_160->parent + (ulong)local_164) =
                               (byte)(local_154 >> 6) | 0xc0;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 1)) =
                               bVar16 & 0x3f | 0x80;
                        }
                        local_164 = local_164 + 2;
                      }
                      else if (local_154 < 0x10000) {
                        if (local_b8 == 0) {
                          *(byte *)((long)&local_160->parent + (ulong)local_164) =
                               (byte)(local_154 >> 0xc) | 0xe0;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 1)) =
                               (byte)(local_154 >> 6) & 0x3f | 0x80;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 2)) =
                               bVar16 & 0x3f | 0x80;
                        }
                        local_164 = local_164 + 3;
                      }
                      else {
                        if (local_b8 == 0) {
                          *(byte *)((long)&local_160->parent + (ulong)local_164) =
                               (byte)(local_154 >> 0x12) | 0xf0;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 1)) =
                               (byte)(local_154 >> 0xc) & 0x3f | 0x80;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 2)) =
                               (byte)(local_154 >> 6) & 0x3f | 0x80;
                          *(byte *)((long)&local_160->parent + (ulong)(local_164 + 3)) =
                               bVar16 & 0x3f | 0x80;
                        }
                        local_164 = local_164 + 4;
                      }
                      break;
                    }
                  }
                }
              }
            }
            sprintf(local_88,"Invalid character value `%c` (at %d:%d)",(ulong)(uint)(int)local_165,
                    (ulong)local_a8,(ulong)local_a4);
            goto LAB_0021a640;
          }
        }
        else if (local_165 == '\\') {
          bVar4 = true;
        }
        else if (local_165 == '\"') {
          if (local_b8 == 0) {
            *(undefined1 *)((long)&local_160->parent + (ulong)local_164) = 0;
          }
          local_160 = (_json_value *)0x0;
          if (local_90->type != json_object) {
            if (local_90->type == json_string) {
              (local_90->u).string.length = local_164;
              bVar2 = true;
            }
            bVar3 = false;
            goto LAB_00219359;
          }
          if (local_b8 == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((local_90->u).string.ptr + (ulong)(local_90->u).string.length * 0x18) =
                 local_90->_reserved;
            *(uint *)((local_90->u).string.ptr + (ulong)(local_90->u).string.length * 0x18 + 8) =
                 local_164;
            (local_90->_reserved).next_alloc =
                 (_json_value *)
                 ((long)&((local_90->_reserved).next_alloc)->parent + (ulong)(local_164 + 1));
          }
          else {
            (local_90->u).string.ptr = (local_90->u).string.ptr + (local_164 + 1);
          }
          local_138 = local_138 | 0x48;
          bVar6 = true;
          bVar3 = false;
        }
        else {
          if (local_b8 == 0) {
            *(char *)((long)&local_160->parent + (ulong)local_164) = local_165;
          }
          local_164 = local_164 + 1;
        }
        goto LAB_0021a58c;
      }
LAB_0021a61c:
      sprintf(local_88,"%d:%d: Too long (caught overflow)",(ulong)local_a8,(ulong)local_a4);
LAB_0021a640:
      if (in_RCX != (char *)0x0) {
        if (local_88[0] == '\0') {
          strcpy(in_RCX,"Unknown error");
        }
        else {
          strcpy(in_RCX,local_88);
        }
      }
      if (local_b8 != 0) {
        local_a0 = local_98;
      }
      while (local_a0 != (json_value *)0x0) {
        local_90 = (local_a0->_reserved).next_alloc;
        (*local_d0)(local_a0,local_c8);
        local_a0 = local_90;
      }
      if (local_b8 == 0) {
        json_value_free_ex(in_stack_fffffffffffffe40,
                           (json_value *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      local_108 = (json_value *)0x0;
      goto LAB_0021a718;
    }
LAB_00219359:
    if ((local_e0 & 1) != 0) {
      if ((local_138 & 0x6000) != 0) {
        if ((local_138 & 0x2000) == 0) {
          if ((local_138 & 0x4000) == 0) goto LAB_002195c2;
          if (local_165 == '\0') {
            sprintf(local_88,"%d:%d: Unexpected EOF in block comment",(ulong)local_a8,
                    (ulong)local_a4);
            goto LAB_0021a640;
          }
          if (((local_165 == '*') && (local_b0 < pcVar21 + -1)) && (local_b0[1] == '/')) {
            local_138 = local_138 & 0xffffffffffffbfff;
            local_b0 = local_b0 + 1;
          }
        }
        else if (((local_165 == '\r') || (local_165 == '\n')) || (local_165 == '\0')) {
          local_138 = local_138 & 0xffffffffffffdfff;
          local_b0 = local_b0 + -1;
        }
        goto LAB_0021a58c;
      }
      if (local_165 != '/') goto LAB_002195c2;
      if (((local_138 & 0x88) == 0) && (local_90->type != json_object)) {
        sprintf(local_88,"%d:%d: Comment not allowed here",(ulong)local_a8,(ulong)local_a4);
      }
      else {
        local_b0 = local_b0 + 1;
        if (local_b0 != pcVar21) {
          cVar24 = *local_b0;
          if (cVar24 == '*') {
            local_138 = local_138 | 0x4000;
          }
          else {
            if (cVar24 != '/') {
              sprintf(local_88,"%d:%d: Unexpected `%c` in comment opening sequence",(ulong)local_a8,
                      (ulong)local_a4,(ulong)(uint)(int)cVar24);
              goto LAB_0021a640;
            }
            local_138 = local_138 | 0x2000;
          }
          goto LAB_0021a58c;
        }
        sprintf(local_88,"%d:%d: EOF unexpected",(ulong)local_a8,(ulong)local_a4);
      }
      goto LAB_0021a640;
    }
LAB_002195c2:
    if ((local_138 & 0x80) == 0) {
      if ((local_138 & 8) == 0) {
        in_stack_fffffffffffffe58 = local_90->type;
        if (in_stack_fffffffffffffe58 == json_object) {
          in_stack_fffffffffffffe54 = (int)local_165;
          if (in_stack_fffffffffffffe54 != 9) {
            if (in_stack_fffffffffffffe54 == 10) {
              local_a8 = local_a8 + 1;
              local_a4 = 0;
            }
            else if ((in_stack_fffffffffffffe54 != 0xd) && (in_stack_fffffffffffffe54 != 0x20)) {
              if (in_stack_fffffffffffffe54 == 0x22) {
                if (bVar5) {
                  sprintf(local_88,"%d:%d: Expected , before \"",(ulong)local_a8,(ulong)local_a4);
                  goto LAB_0021a640;
                }
                bVar3 = true;
                local_160 = (local_90->_reserved).next_alloc;
                local_164 = 0;
              }
              else if (in_stack_fffffffffffffe54 == 0x2c) {
                if (!bVar5) goto LAB_00219f32;
                local_138 = local_138 & 0xfffffffffffffffb;
                bVar5 = false;
              }
              else {
                if (in_stack_fffffffffffffe54 != 0x7d) {
LAB_00219f32:
                  sprintf(local_88,"%d:%d: Unexpected `%c` in object",(ulong)local_a8,
                          (ulong)local_a4,(ulong)(uint)(int)local_165);
                  goto LAB_0021a640;
                }
                local_138 = local_138 & 0xfffffffffffffffb;
                bVar5 = false;
                bVar2 = true;
              }
LAB_0021a41c:
              if (bVar12) {
                bVar12 = false;
                local_b0 = local_b0 + -1;
              }
              if (bVar2) {
                if (local_90->parent == (_json_value *)0x0) {
                  local_138 = local_138 | 0x84;
                  bVar5 = true;
                  bVar2 = false;
                }
                else {
                  if (local_90->parent->type == json_array) {
                    local_138 = local_138 | 0xc;
                  }
                  bVar5 = true;
                  bVar2 = false;
                  if (local_b8 == 0) {
                    p_Var1 = local_90->parent;
                    in_stack_fffffffffffffe3c = p_Var1->type;
                    if (in_stack_fffffffffffffe3c == json_object) {
                      *(_json_value **)
                       ((p_Var1->u).string.ptr + (ulong)(p_Var1->u).string.length * 0x18 + 0x10) =
                           local_90;
                    }
                    else if (in_stack_fffffffffffffe3c == json_array) {
                      *(_json_value **)
                       ((p_Var1->u).string.ptr + (ulong)(p_Var1->u).string.length * 8) = local_90;
                    }
                  }
                  uVar20 = (local_90->parent->u).boolean + 1;
                  (local_90->parent->u).string.length = uVar20;
                  if (local_f8[0] < uVar20) goto LAB_0021a61c;
                  local_90 = local_90->parent;
                }
              }
            }
          }
        }
        else {
          if (1 < in_stack_fffffffffffffe58 - json_integer) goto LAB_0021a41c;
          ppuVar22 = __ctype_b_loc();
          if (((*ppuVar22)[(int)local_165] & 0x800) == 0) {
            if ((local_165 == '+') || (local_165 == '-')) {
              if ((!bVar7) || (bVar9)) goto LAB_0021a1d4;
              if (local_165 == '-') {
                bVar10 = true;
              }
              bVar9 = true;
            }
            else {
              if ((local_165 != '.') || (local_90->type != json_integer)) {
LAB_0021a1d4:
                if (bVar7) {
                  if (local_140 == 0) {
                    sprintf(local_88,"%d:%d: Expected digit after `e`",(ulong)local_a8,
                            (ulong)local_a4);
                    goto LAB_0021a640;
                  }
                  in_stack_fffffffffffffe40 = local_148;
                  if (bVar10) {
                    in_stack_fffffffffffffe40 = (json_settings *)-(long)local_148;
                  }
                  dVar23 = pow(10.0,(double)(long)in_stack_fffffffffffffe40);
                  (local_90->u).dbl = dVar23 * (local_90->u).dbl;
                }
                else {
                  if (local_90->type == json_double) {
                    if (local_140 == 0) {
                      sprintf(local_88,"%d:%d: Expected digit after `.`",(ulong)local_a8,
                              (ulong)local_a4);
                      goto LAB_0021a640;
                    }
                    in_stack_fffffffffffffe48 = (json_value **)(double)local_150;
                    dVar23 = pow(10.0,(double)local_140);
                    (local_90->u).dbl =
                         (double)in_stack_fffffffffffffe48 / dVar23 + (local_90->u).dbl;
                  }
                  if ((local_165 == 'e') || (local_165 == 'E')) {
                    if (local_90->type == json_integer) {
                      local_90->type = json_double;
                      (local_90->u).dbl = (double)(local_90->u).integer;
                    }
                    local_140 = 0;
                    bVar8 = false;
                    bVar7 = true;
                    goto LAB_0021a58c;
                  }
                }
                if (bVar11) {
                  if (local_90->type == json_integer) {
                    (local_90->u).integer = -(local_90->u).integer;
                  }
                  else {
                    (local_90->u).integer = (local_90->u).integer ^ 0x8000000000000000;
                  }
                }
                bVar12 = true;
                bVar2 = true;
                goto LAB_0021a41c;
              }
              if (local_140 == 0) {
                sprintf(local_88,"%d:%d: Expected digit before `.`",(ulong)local_a8,(ulong)local_a4)
                ;
                goto LAB_0021a640;
              }
              local_90->type = json_double;
              (local_90->u).dbl = (double)(local_90->u).integer;
              local_140 = 0;
            }
          }
          else {
            local_140 = local_140 + 1;
            if ((local_90->type == json_integer) || (bVar7)) {
              if (bVar7) {
                bVar9 = true;
                local_148 = (json_settings *)((long)local_148 * 10 + (long)(local_165 + -0x30));
              }
              else {
                if (bVar8) {
                  sprintf(local_88,"%d:%d: Unexpected `0` before `%c`",(ulong)local_a8,
                          (ulong)local_a4,(ulong)(uint)(int)local_165);
                  goto LAB_0021a640;
                }
                if ((local_140 == 1) && (local_165 == '0')) {
                  bVar8 = true;
                }
                (local_90->u).integer = (local_90->u).integer * 10 + (long)(local_165 + -0x30);
              }
            }
            else {
              local_150 = local_150 * 10 + (long)(local_165 + -0x30);
            }
          }
        }
      }
      else if (local_165 != '\t') {
        if (local_165 == '\n') {
          local_a8 = local_a8 + 1;
          local_a4 = 0;
        }
        else if ((local_165 != '\r') && (local_165 != ' ')) {
          if (local_165 == ']') {
            if ((local_90 != (_json_value *)0x0) && (local_90->type == json_array)) {
              local_138 = local_138 & 0xfffffffffffffff3;
              bVar5 = false;
              bVar2 = true;
              goto LAB_0021a41c;
            }
            sprintf(local_88,"%d:%d: Unexpected ]",(ulong)local_a8,(ulong)local_a4);
          }
          else if (bVar5) {
            if (local_165 == ',') {
              local_138 = local_138 & 0xfffffffffffffffb;
              bVar5 = false;
              goto LAB_0021a58c;
            }
            sprintf(local_88,"%d:%d: Expected , before %c",(ulong)local_a8,(ulong)local_a4,
                    (ulong)(uint)(int)local_165);
          }
          else if (bVar6) {
            if (local_165 == ':') {
              local_138 = local_138 & 0xffffffffffffffbf;
              bVar6 = false;
              goto LAB_0021a58c;
            }
            sprintf(local_88,"%d:%d: Expected : before %c",(ulong)local_a8,(ulong)local_a4,
                    (ulong)(uint)(int)local_165);
          }
          else {
            local_138 = local_138 & 0xfffffffffffffff7;
            if (local_165 == '\"') {
              iVar19 = new_value((json_state *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 (json_value **)
                                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                 in_stack_fffffffffffffe48,(json_value **)in_stack_fffffffffffffe40,
                                 in_stack_fffffffffffffe3c);
              if (iVar19 != 0) {
                bVar3 = true;
                local_160 = (_json_value *)(local_90->u).object.values;
                local_164 = 0;
                goto LAB_0021a58c;
              }
            }
            else if (local_165 == '[') {
              iVar19 = new_value((json_state *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 (json_value **)
                                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                 in_stack_fffffffffffffe48,(json_value **)in_stack_fffffffffffffe40,
                                 in_stack_fffffffffffffe3c);
              if (iVar19 != 0) {
                local_138 = local_138 | 8;
                goto LAB_0021a58c;
              }
            }
            else {
              pcVar14 = local_b0;
              if (local_165 == 'f') {
                if (((((long)pcVar21 - (long)local_b0 < 4) ||
                     (pcVar14 = local_b0 + 1, local_b0[1] != 'a')) ||
                    (pcVar14 = local_b0 + 2, local_b0[2] != 'l')) ||
                   ((pcVar14 = local_b0 + 3, local_b0[3] != 's' ||
                    (pcVar14 = local_b0 + 4, local_b0[4] != 'e')))) {
LAB_0021a5e0:
                  local_b0 = pcVar14;
                  sprintf(local_88,"%d:%d: Unknown value",(ulong)local_a8,(ulong)local_a4);
                  goto LAB_0021a640;
                }
                local_b0 = local_b0 + 4;
                iVar19 = new_value((json_state *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                   (json_value **)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   in_stack_fffffffffffffe48,
                                   (json_value **)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
                if (iVar19 != 0) {
                  bVar2 = true;
                  goto LAB_0021a41c;
                }
              }
              else if (local_165 == 'n') {
                if ((((long)pcVar21 - (long)local_b0 < 3) ||
                    (pcVar14 = local_b0 + 1, local_b0[1] != 'u')) ||
                   ((pcVar14 = local_b0 + 2, local_b0[2] != 'l' ||
                    (pcVar14 = local_b0 + 3, local_b0[3] != 'l')))) goto LAB_0021a5e0;
                local_b0 = local_b0 + 3;
                iVar19 = new_value((json_state *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                   (json_value **)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   in_stack_fffffffffffffe48,
                                   (json_value **)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
                if (iVar19 != 0) {
                  bVar2 = true;
                  goto LAB_0021a41c;
                }
              }
              else if (local_165 == 't') {
                if (((((long)pcVar21 - (long)local_b0 < 3) ||
                     (pcVar14 = local_b0 + 1, local_b0[1] != 'r')) ||
                    (pcVar14 = local_b0 + 2, local_b0[2] != 'u')) ||
                   (pcVar14 = local_b0 + 3, local_b0[3] != 'e')) goto LAB_0021a5e0;
                local_b0 = local_b0 + 3;
                iVar19 = new_value((json_state *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                   (json_value **)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   in_stack_fffffffffffffe48,
                                   (json_value **)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
                if (iVar19 != 0) {
                  (local_90->u).boolean = 1;
                  bVar2 = true;
                  goto LAB_0021a41c;
                }
              }
              else if (local_165 == '{') {
                iVar19 = new_value((json_state *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                   (json_value **)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   in_stack_fffffffffffffe48,
                                   (json_value **)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
                if (iVar19 != 0) goto LAB_0021a58c;
              }
              else {
                ppuVar22 = __ctype_b_loc();
                if ((((*ppuVar22)[(int)local_165] & 0x800) == 0) && (local_165 != '-')) {
                  sprintf(local_88,"%d:%d: Unexpected %c when seeking value",(ulong)local_a8,
                          (ulong)local_a4,(ulong)(uint)(int)local_165);
                  goto LAB_0021a640;
                }
                iVar19 = new_value((json_state *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                   (json_value **)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   in_stack_fffffffffffffe48,
                                   (json_value **)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
                if (iVar19 != 0) {
                  if (local_b8 == 0) {
                    while( true ) {
                      ppuVar22 = __ctype_b_loc();
                      uVar25 = (undefined3)in_stack_fffffffffffffe5c;
                      in_stack_fffffffffffffe5c = CONCAT13(1,uVar25);
                      if (((((*ppuVar22)[(int)local_165] & 0x800) == 0) &&
                          (in_stack_fffffffffffffe5c = CONCAT13(1,uVar25), local_165 != '+')) &&
                         ((in_stack_fffffffffffffe5c = CONCAT13(1,uVar25), local_165 != '-' &&
                          ((in_stack_fffffffffffffe5c = CONCAT13(1,uVar25), local_165 != 'e' &&
                           (in_stack_fffffffffffffe5c = CONCAT13(1,uVar25), local_165 != 'E')))))) {
                        in_stack_fffffffffffffe5c = CONCAT13(local_165 == '.',uVar25);
                      }
                      if (((char)((uint)in_stack_fffffffffffffe5c >> 0x18) == '\0') ||
                         (local_b0 = local_b0 + 1, local_b0 == pcVar21)) break;
                      local_165 = *local_b0;
                    }
                    bVar12 = true;
                    bVar2 = true;
                  }
                  else {
                    local_138 = uVar13 & 0xffffffffffffe0f7;
                    local_140 = 0;
                    local_150 = 0;
                    local_148 = (json_settings *)0x0;
                    if (local_165 == '-') {
                      bVar11 = true;
                      bVar10 = false;
                      bVar9 = false;
                      bVar8 = false;
                      bVar7 = false;
                      goto LAB_0021a58c;
                    }
                    bVar12 = true;
                    bVar11 = false;
                    bVar10 = false;
                    bVar9 = false;
                    bVar8 = false;
                    bVar7 = false;
                  }
                  goto LAB_0021a41c;
                }
              }
            }
            strcpy(local_88,"Memory allocation failure");
          }
          goto LAB_0021a640;
        }
      }
    }
    else {
      if (local_165 == '\0') break;
      switch(local_165) {
      case '\n':
        local_a8 = local_a8 + 1;
        local_a4 = 0;
      case '\t':
      case '\r':
      case ' ':
        break;
      default:
        sprintf(local_88,"%d:%d: Trailing garbage: `%c`",(ulong)local_a8,(ulong)local_a4,
                (ulong)(uint)(int)local_165);
        goto LAB_0021a640;
      }
    }
LAB_0021a58c:
    local_b0 = local_b0 + 1;
  } while( true );
  local_a0 = local_98;
  local_b8 = local_b8 + -1;
  goto LAB_00218a23;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value * top, * root, * alloc = 0;
   json_state state = { 0 };
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.mem_alloc)
      state.settings.mem_alloc = default_alloc;

   if (!state.settings.mem_free)
      state.settings.mem_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);
         
         if (flags & flag_string)
         {
            if (!b)
            {  sprintf (error, "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr <= 4 || 
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;
                        
                        if (end - state.ptr <= 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;
                        
                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }
                        
                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {  
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  sprintf (error, "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  sprintf (error, "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  sprintf (error, "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  sprintf (error, "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  sprintf (error, "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        sprintf (error, "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     { 
                        sprintf (error, "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  sprintf (error, "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:
               
               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  sprintf (error, "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;
                  
                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  sprintf (error, "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  sprintf (error, "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;
               
            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   sprintf (error, "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   sprintf (error, "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.mem_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}